

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_callback_cancel_nolock_(event_base *base,event_callback *evcb,int even_if_finalizing)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  unsigned_long uVar4;
  void *pvVar5;
  _func_void_int_short_void_ptr *p_Var6;
  eventop *peVar7;
  eventop *peVar8;
  long lVar9;
  event_change *peVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  int extraout_EAX;
  _func_unsigned_long *p_Var14;
  unsigned_long uVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 uVar18;
  event_callback *evcb_00;
  event_callback *extraout_RDX;
  event_callback *extraout_RDX_00;
  event_callback *extraout_RDX_01;
  event_callback *extraout_RDX_02;
  event_callback *extraout_RDX_03;
  event_callback *extraout_RDX_04;
  event_callback *extraout_RDX_05;
  event_callback *extraout_RDX_06;
  event_callback *extraout_RDX_07;
  event_callback *extraout_RDX_08;
  event_callback *extraout_RDX_09;
  event_callback *extraout_RDX_10;
  event_callback *extraout_RDX_11;
  event_callback *extraout_RDX_12;
  event_callback *extraout_RDX_13;
  event_callback *extraout_RDX_14;
  ulong uVar19;
  event_callback *extraout_RDX_15;
  ulong *puVar20;
  event_callback **ppeVar21;
  event *ev;
  event_base *peVar22;
  void *pvVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  char *pcVar27;
  char *pcVar28;
  int unaff_R12D;
  evthread_lock_callbacks *unaff_R13;
  timeval *tv;
  event_base *unaff_R14;
  event_base *unaff_R15;
  bool bVar29;
  event_callback *peStack_30;
  undefined1 auStack_18 [8];
  
  ppeVar21 = (event_callback **)auStack_18;
  uVar3 = evcb->evcb_flags;
  peVar22 = (event_base *)CONCAT71((int7)((ulong)evcb >> 8),even_if_finalizing == 0);
  if ((even_if_finalizing == 0 & (byte)((uVar3 & 0x40) >> 6)) != 0) {
    UINT_00224d4c._3_1_ = 0xff;
    return 0;
  }
  if ((char)uVar3 < '\0') {
    event_callback_to_event(evcb);
    iVar12 = event_del_nolock_((event *)evcb,3 - (uint)(even_if_finalizing == 0));
    return iVar12;
  }
  uVar16 = uVar3 >> 3 & 5;
  p_Var14 = (_func_unsigned_long *)(ulong)uVar16;
  evcb_00 = (event_callback *)
            ((long)&switchD_001ff6e5::switchdataD_00224d28 +
            (long)(int)(&switchD_001ff6e5::switchdataD_00224d28)[(long)p_Var14]);
  bVar29 = evcb_00 == (event_callback *)0x0;
  switch(uVar16) {
  case 0:
    goto switchD_001ff6e5_caseD_0;
  case 1:
    event_queue_remove_active(base,evcb);
    break;
  default:
    ppeVar21 = &peStack_30;
    peStack_30 = evcb;
    uVar3 = *(ushort *)&(peVar22->changelist).changes;
    p_Var14 = (_func_unsigned_long *)(ulong)uVar3;
    evcb = (event_callback *)0x0;
    unaff_R14 = base;
    unaff_R15 = peVar22;
    if ((uVar3 & 0x40) != 0) goto switchD_001ff77b_caseD_1;
    goto code_r0x001ff767;
  case 4:
    event_queue_remove_active_later(base,evcb);
    break;
  case 5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xc0d,"0","event_callback_cancel_nolock_");
  case 6:
    peVar22 = (event_base *)((ulong)base & 0xffffffff);
    ppeVar21 = (event_callback **)auStack_18;
code_r0x001ff767:
    uVar13 = (uint)((ulong)p_Var14 >> 3) & 5;
    uVar16 = (&switchD_001ff77b::switchdataD_00224d40)[uVar13];
    switch(uVar13) {
    case 0:
      *(undefined8 *)((long)ppeVar21 + -8) = 1;
      evcb = *(event_callback **)((long)ppeVar21 + -8);
      break;
    case 1:
      goto switchD_001ff77b_caseD_1;
    default:
      *(event_base **)((long)ppeVar21 + -8) = unaff_R15;
      *(event_base **)((long)ppeVar21 + -0x10) = unaff_R14;
      *(event_callback **)((long)ppeVar21 + -0x18) = evcb;
      pvVar23 = base->th_base_lock;
      if (pvVar23 != (void *)0x0) {
        *(undefined8 *)((long)ppeVar21 + -0x20) = 0x1ff939;
        (*evthread_lock_fns_.lock)(0,pvVar23);
      }
      *(undefined8 *)((long)ppeVar21 + -0x20) = 0x1ff947;
      event_callback_finalize_nolock_
                (base,(uint)pvVar23,evcb_00,
                 (_func_void_event_callback_ptr_void_ptr *)&switchD_001ff77b::switchdataD_00224d40);
      if (base->th_base_lock != (void *)0x0) {
        iVar12 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        return iVar12;
      }
      return extraout_EAX;
    case 4:
      *(undefined8 *)((long)ppeVar21 + -8) = 0x1ff78d;
      event_queue_remove_active_later(unaff_R14,(event_callback *)unaff_R15);
      evcb = (event_callback *)0x0;
      break;
    case 5:
      pcVar27 = "0";
      pcVar28 = "event_callback_activate_nolock_";
      uVar18 = 0xbcb;
      goto LAB_001ff8e4;
    case 6:
switchD_001ff77b_caseD_6:
      *(undefined8 *)((long)ppeVar21 + -8) = 0x20161c;
      (*evthread_lock_fns_.unlock)((uint)base,peVar22);
LAB_0020161c:
      pvVar23 = (((event *)unaff_R13)->ev_evcallback).evcb_arg;
      *(undefined8 *)((long)ppeVar21 + -8) = 0x201625;
      (*(code *)evcb)(unaff_R13,pvVar23);
      evcb_00 = extraout_RDX_09;
LAB_002017fa:
      unaff_R14 = (event_base *)*ppeVar21;
      unaff_R13 = &evthread_lock_fns_;
LAB_00201805:
      pvVar23 = unaff_R15->th_base_lock;
      if (pvVar23 != (void *)0x0) {
        p_Var6 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        ppeVar21[-1] = (event_callback *)0x201817;
        (*p_Var6)(0,(short)pvVar23,evcb_00);
      }
      unaff_R15->current_event = (event_callback *)0x0;
      if (unaff_R15->current_event_waiters != 0) {
        unaff_R15->current_event_waiters = 0;
        pvVar23 = unaff_R15->current_event_cond;
        if (pvVar23 != (void *)0x0) {
          ppeVar21[-1] = (event_callback *)0x1;
          uVar18 = ppeVar21[-1];
          ppeVar21[-1] = (event_callback *)0x20184a;
          (*evthread_cond_fns_.signal_condition)(pvVar23,(int)uVar18);
        }
      }
      if (unaff_R15->event_break != 0) {
        ppeVar21[-1] = (event_callback *)0xffffffffffffffff;
        return (int)ppeVar21[-1];
      }
      if (*(int *)((long)ppeVar21 + 0x2c) <= unaff_R12D) {
        return unaff_R12D;
      }
      if ((unaff_R14 != (event_base *)0x0) && (unaff_R12D != 0)) {
        ppeVar21[-1] = (event_callback *)0x20186d;
        update_time_cache(unaff_R15);
        ppeVar21[-1] = (event_callback *)0x20187a;
        gettime(unaff_R15,(timeval *)(ppeVar21 + 1));
        peVar7 = unaff_R14->evsel;
        peVar8 = (eventop *)ppeVar21[1];
        bVar29 = SBORROW8((long)peVar8,(long)peVar7);
        lVar9 = (long)peVar8 - (long)peVar7;
        if (peVar8 == peVar7) {
          bVar29 = SBORROW8((long)ppeVar21[2],(long)unaff_R14->evbase);
          lVar9 = (long)ppeVar21[2] - (long)unaff_R14->evbase;
        }
        if (bVar29 == lVar9 < 0) {
          return unaff_R12D;
        }
      }
      if (unaff_R15->event_continue != 0) {
        return unaff_R12D;
      }
      unaff_R13 = *(evthread_lock_callbacks **)ppeVar21[6];
      if ((event *)unaff_R13 == (event *)0x0) {
        return unaff_R12D;
      }
      if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x80) == 0) {
        ppeVar21[-1] = (event_callback *)0x2013f3;
        event_queue_remove_active(unaff_R15,(event_callback *)unaff_R13);
        evcb_00 = extraout_RDX;
        if (event_debug_logging_mask_ != 0) {
          bVar1 = (((event *)unaff_R13)->ev_evcallback).evcb_closure;
          p_Var6 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
          ppeVar21[-1] = (event_callback *)0x201419;
          event_debugx_("event_process_active: event_callback %p, closure %d, call %p",unaff_R13,
                        (ulong)bVar1,p_Var6);
          evcb_00 = extraout_RDX_00;
        }
        ev = (event *)0x0;
      }
      else {
        ppeVar21[-1] = (event_callback *)0x201428;
        event_callback_to_event((event_callback *)unaff_R13);
        if (((((event *)unaff_R13)->ev_events & 0x10) == 0) &&
           (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0)) {
          ppeVar21[-1] = (event_callback *)0x201440;
          event_del_nolock_((event *)unaff_R13,0);
          evcb_00 = extraout_RDX_01;
        }
        else {
          ppeVar21[-1] = (event_callback *)0x20144d;
          event_queue_remove_active(unaff_R15,(event_callback *)unaff_R13);
          evcb_00 = extraout_RDX_02;
        }
        ev = (event *)unaff_R13;
        if (event_debug_logging_mask_ != 0) {
          uVar3 = ((event *)unaff_R13)->ev_res;
          pcVar27 = "EV_READ ";
          if ((uVar3 & 2) == 0) {
            pcVar27 = " ";
          }
          pcVar28 = "EV_WRITE ";
          if ((uVar3 & 4) == 0) {
            pcVar28 = " ";
          }
          pcVar25 = "EV_CLOSED ";
          if (-1 < (char)uVar3) {
            pcVar25 = " ";
          }
          p_Var6 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
          ppeVar21[-1] = (event_callback *)0x2014a4;
          event_debugx_("event_process_active: event: %p, %s%s%scall %p",unaff_R13,pcVar27,pcVar28,
                        pcVar25,p_Var6);
          evcb_00 = extraout_RDX_03;
        }
      }
      unaff_R12D = unaff_R12D +
                   (uint)(((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x10U) == 0);
      unaff_R15->current_event = (event_callback *)unaff_R13;
      unaff_R15->current_event_waiters = 0;
      uVar2 = (((event *)unaff_R13)->ev_evcallback).evcb_closure;
      switch(uVar2) {
      case '\0':
        if (ev == (event *)0x0) {
          pcVar27 = "ev != NULL";
          pcVar28 = "event_process_active_single_queue";
          uVar18 = 0x69d;
          goto LAB_002019ff;
        }
        p_Var6 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        sVar11 = ev->ev_res;
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          ppeVar21[-1] = (event_callback *)0x201655;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
        }
        iVar12 = ev->ev_fd;
        pvVar23 = (ev->ev_evcallback).evcb_arg;
        ppeVar21[-1] = (event_callback *)0x201662;
        (*p_Var6)(iVar12,sVar11,pvVar23);
        unaff_R14 = (event_base *)*ppeVar21;
        evcb_00 = extraout_RDX_10;
        goto LAB_00201805;
      case '\x01':
        if (ev == (event *)0x0) {
          pcVar27 = "ev != NULL";
          pcVar28 = "event_process_active_single_queue";
          uVar18 = 0x693;
          goto LAB_002019ff;
        }
        sVar11 = (ev->ev_).ev_signal.ev_ncalls;
        *(short *)(ppeVar21 + 1) = sVar11;
        if (sVar11 != 0) {
          (ev->ev_).ev_signal.ev_pncalls = (short *)(ppeVar21 + 1);
        }
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R14 = (event_base *)*ppeVar21;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          ppeVar21[-1] = (event_callback *)0x2016a8;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_11;
        }
        do {
          if (*(short *)(ppeVar21 + 1) == 0) goto LAB_00201805;
          sVar11 = *(short *)(ppeVar21 + 1) + -1;
          *(short *)(ppeVar21 + 1) = sVar11;
          (ev->ev_).ev_signal.ev_ncalls = sVar11;
          if (sVar11 == 0) {
            (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
          }
          iVar12 = ev->ev_fd;
          sVar11 = ev->ev_res;
          pvVar23 = (ev->ev_evcallback).evcb_arg;
          p_Var6 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
          ppeVar21[-1] = (event_callback *)0x2016d7;
          (*p_Var6)(iVar12,sVar11,pvVar23);
          pvVar23 = unaff_R15->th_base_lock;
          if (pvVar23 == (void *)0x0) {
            iVar12 = unaff_R15->event_break;
            evcb_00 = extraout_RDX_12;
          }
          else {
            ppeVar21[-1] = (event_callback *)0x2016e9;
            (*evthread_lock_fns_.lock)(0,pvVar23);
            pvVar23 = unaff_R15->th_base_lock;
            iVar12 = unaff_R15->event_break;
            evcb_00 = extraout_RDX_13;
            if (pvVar23 != (void *)0x0) {
              ppeVar21[-1] = (event_callback *)0x201702;
              (*evthread_lock_fns_.unlock)(0,pvVar23);
              evcb_00 = extraout_RDX_14;
            }
          }
        } while (iVar12 == 0);
        if (*(short *)(ppeVar21 + 1) != 0) {
          (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        goto LAB_00201805;
      case '\x02':
        goto switchD_002014e3_caseD_2;
      case '\x03':
        evcb = (event_callback *)(((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        peVar22 = (event_base *)unaff_R15->th_base_lock;
        if (peVar22 == (event_base *)0x0) goto LAB_0020161c;
        base = (event_base *)0x0;
        goto switchD_001ff77b_caseD_6;
      case '\x04':
        p_Var6 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        unaff_R15->current_event = (event_callback *)0x0;
        if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0) {
          pcVar27 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
          pcVar28 = "event_process_active_single_queue";
          uVar18 = 0x6bc;
          goto LAB_002019ff;
        }
        pvVar23 = unaff_R15->th_base_lock;
        if (pvVar23 != (void *)0x0) {
          ppeVar21[-1] = (event_callback *)0x201579;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_07;
        }
        pvVar23 = (((event *)unaff_R13)->ev_evcallback).evcb_arg;
        ppeVar21[-1] = (event_callback *)0x201583;
        (*p_Var6)((int)unaff_R13,(short)pvVar23,evcb_00);
        evcb_00 = extraout_RDX_08;
        goto LAB_002017fa;
      case '\x05':
      case '\x06':
        if (ev == (event *)0x0) {
          pcVar27 = "ev != NULL";
          pcVar28 = "event_process_active_single_queue";
          uVar18 = 0x6ae;
          goto LAB_002019ff;
        }
        unaff_R15->current_event = (event_callback *)0x0;
        if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0) {
          pcVar27 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
          pcVar28 = "event_process_active_single_queue";
          uVar18 = 0x6b1;
          goto LAB_002019ff;
        }
        p_Var6 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        pvVar23 = unaff_R15->th_base_lock;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar23 != (void *)0x0) {
          ppeVar21[-1] = (event_callback *)0x20151e;
          (*evthread_lock_fns_.unlock)(0,pvVar23);
          evcb_00 = extraout_RDX_04;
        }
        pvVar23 = (ev->ev_evcallback).evcb_arg;
        ppeVar21[-1] = (event_callback *)0x201527;
        (*p_Var6)((int)ev,(short)pvVar23,evcb_00);
        ppeVar21[-1] = (event_callback *)0x20152f;
        event_debug_note_teardown_(ev);
        unaff_R14 = (event_base *)*ppeVar21;
        evcb_00 = extraout_RDX_05;
        if (uVar2 == '\x06') {
          ppeVar21[-1] = (event_callback *)0x201545;
          event_mm_free_(ev);
          evcb_00 = extraout_RDX_06;
        }
        goto LAB_00201805;
      default:
        pcVar27 = "0";
        pcVar28 = "event_process_active_single_queue";
        uVar18 = 0x6c2;
        goto LAB_002019ff;
      }
    case 7:
      *(ulong *)((long)ppeVar21 + -8) = (ulong)(uint)even_if_finalizing;
      evcb[-0x2eafe97].field_0x15 = evcb[-0x2eafe97].field_0x15 & 0x40;
      puVar20 = (ulong *)((long)ppeVar21 + -0x10);
      ppeVar21 = (event_callback **)((long)ppeVar21 + -0x10);
      *puVar20 = (ulong)(uint)even_if_finalizing;
      UINT_00224d4c._3_1_ = (char)uVar16 + '@';
      goto LAB_00201805;
    }
    pvVar23 = unaff_R14->th_base_lock;
    if ((pvVar23 != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
      *(undefined8 *)((long)ppeVar21 + -8) = 0x1ff7ac;
      iVar12 = evthread_is_debug_lock_held_(pvVar23);
      if (iVar12 == 0) {
        pcVar27 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
        pcVar28 = "event_queue_insert_active";
        uVar18 = 0xd36;
        goto LAB_001ff8e4;
      }
    }
    peVar10 = (unaff_R15->changelist).changes;
    if (((ulong)peVar10 & 8) == 0) {
      iVar12 = unaff_R14->event_count + (uint)(((ulong)peVar10 & 0x10) == 0);
      unaff_R14->event_count = iVar12;
      if (iVar12 < unaff_R14->event_count_max) {
        iVar12 = unaff_R14->event_count_max;
      }
      unaff_R14->event_count_max = iVar12;
      *(byte *)&(unaff_R15->changelist).changes = *(byte *)&(unaff_R15->changelist).changes | 8;
      iVar12 = unaff_R14->event_count_active + 1;
      unaff_R14->event_count_active = iVar12;
      if (iVar12 < unaff_R14->event_count_active_max) {
        iVar12 = unaff_R14->event_count_active_max;
      }
      unaff_R14->event_count_active_max = iVar12;
      bVar1 = *(byte *)((long)&(unaff_R15->changelist).changes + 2);
      if (unaff_R14->nactivequeues <= (int)(uint)bVar1) {
        pcVar27 = "evcb->evcb_pri < base->nactivequeues";
        pcVar28 = "event_queue_insert_active";
        uVar18 = 0xd43;
LAB_001ff8e4:
        *(undefined8 *)((long)ppeVar21 + -8) = 0x1ff8eb;
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,uVar18,pcVar27,pcVar28);
      }
      unaff_R15->evsel = (eventop *)0x0;
      unaff_R15->evbase = unaff_R14->activequeues[bVar1].tqh_last;
      *unaff_R14->activequeues[bVar1].tqh_last = (event_callback *)unaff_R15;
      unaff_R14->activequeues[*(byte *)((long)&(unaff_R15->changelist).changes + 2)].tqh_last =
           (event_callback **)unaff_R15;
    }
    if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
      bVar29 = unaff_R14->running_loop == 0;
      p_Var14 = evthread_id_fn_;
switchD_001ff6e5_caseD_7:
      if (!bVar29) {
        uVar4 = unaff_R14->th_owner_id;
        *(undefined8 *)((long)ppeVar21 + -8) = 0x1ff881;
        uVar15 = (*p_Var14)();
        if (uVar4 != uVar15) {
          *(undefined8 *)((long)ppeVar21 + -8) = 0x1ff88e;
          evthread_notify_base(unaff_R14);
        }
      }
    }
switchD_001ff77b_caseD_1:
    return (int)evcb;
  case 7:
    goto switchD_001ff6e5_caseD_7;
  }
  uVar16 = 0;
switchD_001ff6e5_caseD_0:
  return uVar16;
switchD_002014e3_caseD_2:
  if (ev == (event *)0x0) {
    pcVar27 = "ev != NULL";
    pcVar28 = "event_process_active_single_queue";
    uVar18 = 0x697;
LAB_002019ff:
    ppeVar21[-1] = (event_callback *)0x201a06;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,uVar18,pcVar27,pcVar28);
  }
  uVar17 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if ((ev->ev_).ev_io.ev_timeout.tv_sec == 0 && uVar17 == 0) goto LAB_002017c7;
  if (0xfffff < (uVar17 ^ (ev->ev_timeout).tv_usec)) {
    pcVar27 = "is_same_common_timeout(&ev->ev_timeout, &ev->ev_io_timeout)";
    pcVar28 = "event_persist_closure";
    uVar18 = 0x632;
    goto LAB_002019ff;
  }
  tv = &ev->ev_timeout;
  ppeVar21[-1] = (event_callback *)0x2015c3;
  gettime(unaff_R15,(timeval *)(ppeVar21 + 3));
  ppeVar21[-1] = (event_callback *)0x2015ce;
  iVar12 = is_common_timeout(tv,unaff_R15);
  uVar17 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if (iVar12 == 0) {
    if ((ev->ev_res & 1) == 0) {
      uVar16 = 0;
      goto LAB_0020172d;
    }
    uVar19 = (ev->ev_timeout).tv_usec;
    uVar16 = 0;
  }
  else {
    uVar16 = (uint)uVar17 & 0xfff00000;
    uVar17 = (ulong)((uint)uVar17 & 0xfffff);
    if ((ev->ev_res & 1) == 0) {
LAB_0020172d:
      uVar19 = (ulong)ppeVar21[4];
      tv = (timeval *)(ppeVar21 + 3);
    }
    else {
      uVar19 = (ulong)((uint)(ev->ev_timeout).tv_usec & 0xfffff);
    }
  }
  lVar9 = (ev->ev_).ev_io.ev_timeout.tv_sec;
  lVar26 = tv->tv_sec + lVar9;
  ppeVar21[1] = (event_callback *)lVar26;
  uVar19 = uVar19 + uVar17;
  if (999999 < (long)uVar19) {
    lVar26 = lVar26 + 1;
    ppeVar21[1] = (event_callback *)lVar26;
    uVar19 = uVar19 - 1000000;
  }
  lVar24 = (long)ppeVar21[3];
  if (lVar26 == lVar24) {
    lVar26 = (long)ppeVar21[4];
    if ((long)uVar19 < lVar26) {
LAB_00201787:
      lVar24 = lVar24 + lVar9;
      ppeVar21[1] = (event_callback *)lVar24;
      uVar19 = lVar26 + uVar17;
      if (999999 < (long)uVar19) {
        ppeVar21[1] = (event_callback *)(lVar24 + 1);
        uVar19 = uVar19 - 1000000;
      }
    }
  }
  else if (lVar26 < lVar24) {
    lVar26 = (long)ppeVar21[4];
    goto LAB_00201787;
  }
  ppeVar21[2] = (event_callback *)(uVar16 | uVar19);
  ppeVar21[-1] = (event_callback *)0x1;
  uVar18 = ppeVar21[-1];
  ppeVar21[-1] = (event_callback *)0x2017c7;
  event_add_nolock_(ev,(timeval *)(ppeVar21 + 1),(int)uVar18);
LAB_002017c7:
  p_Var6 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
  pvVar23 = (ev->ev_evcallback).evcb_arg;
  iVar12 = ev->ev_fd;
  sVar11 = ev->ev_res;
  pvVar5 = unaff_R15->th_base_lock;
  if (pvVar5 != (void *)0x0) {
    ppeVar21[-1] = (event_callback *)0x2017ef;
    (*evthread_lock_fns_.unlock)(0,pvVar5);
  }
  ppeVar21[-1] = (event_callback *)0x2017fa;
  (*p_Var6)(iVar12,sVar11,pvVar23);
  evcb_00 = extraout_RDX_15;
  goto LAB_002017fa;
}

Assistant:

int
event_callback_cancel_nolock_(struct event_base *base,
    struct event_callback *evcb, int even_if_finalizing)
{
	if ((evcb->evcb_flags & EVLIST_FINALIZING) && !even_if_finalizing)
		return 0;

	if (evcb->evcb_flags & EVLIST_INIT)
		return event_del_nolock_(event_callback_to_event(evcb),
		    even_if_finalizing ? EVENT_DEL_EVEN_IF_FINALIZING : EVENT_DEL_AUTOBLOCK);

	switch ((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		event_queue_remove_active(base, evcb);
		return 0;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		break;
	case 0:
		break;
	}

	return 0;
}